

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_0::CopyImageTests::init
          (CopyImageTests *this,EVP_PKEY_CTX *ctx)

{
  size_t *this_00;
  ViewClass VVar1;
  deUint32 format;
  deUint32 format_00;
  Context *pCVar2;
  bool bVar3;
  int extraout_EAX;
  TestCaseGroup *pTVar4;
  TestCaseGroup *this_01;
  TestCaseGroup *this_02;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar7;
  TestCaseGroup *this_03;
  pointer ppVar8;
  pointer ppVar9;
  char *pcVar10;
  char *pcVar11;
  size_type sVar12;
  const_reference pvVar13;
  deUint32 dstFormat_2;
  deUint32 srcFormat_2;
  int dstFormatNdx_2;
  int srcFormatNdx_2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> compressedFormats;
  vector<unsigned_int,_std::allocator<unsigned_int>_> nonCompressedFormats;
  TestCaseGroup *viewGroup_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_990;
  undefined1 local_970 [8];
  string viewClassName;
  iterator iStack_948;
  ViewClass viewClass_2;
  _Rb_tree_const_iterator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  local_940;
  iterator local_938;
  _Rb_tree_const_iterator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  local_930;
  const_iterator iter;
  deUint32 dstFormat_1;
  deUint32 srcFormat_1;
  int dstFormatNdx_1;
  int srcFormatNdx_1;
  TestCaseGroup *viewGroup_1;
  ViewClass viewClass_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *formats_1;
  _Rb_tree_const_iterator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_8f8;
  iterator local_8f0;
  _Rb_tree_const_iterator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_8e8;
  const_iterator viewClassIter_1;
  deUint32 dstFormat;
  deUint32 srcFormat;
  int dstFormatNdx;
  int srcFormatNdx;
  TestCaseGroup *viewGroup;
  ViewClass viewClass;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *formats;
  _Rb_tree_const_iterator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_8b0;
  iterator local_8a8;
  _Rb_tree_const_iterator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_8a0;
  const_iterator viewClassIter;
  key_type local_890;
  value_type_conflict2 local_88c;
  key_type local_888;
  value_type_conflict2 local_884;
  key_type local_880;
  value_type_conflict2 local_87c;
  key_type local_878;
  value_type_conflict2 local_874;
  key_type local_870;
  value_type_conflict2 local_86c;
  key_type local_868;
  value_type_conflict2 local_864;
  key_type local_860;
  value_type_conflict2 local_85c;
  key_type local_858;
  value_type_conflict2 local_854;
  key_type local_850;
  value_type_conflict2 local_84c;
  key_type local_848;
  value_type_conflict2 local_844;
  key_type local_840;
  value_type_conflict2 local_83c;
  key_type local_838;
  value_type_conflict2 local_834;
  key_type local_830;
  value_type_conflict2 local_82c;
  key_type local_828;
  value_type_conflict2 local_824;
  key_type local_820;
  value_type_conflict2 local_81c;
  key_type local_818;
  value_type_conflict2 local_814;
  key_type local_810;
  value_type_conflict2 local_80c;
  key_type local_808;
  value_type_conflict2 local_804;
  key_type local_800;
  value_type_conflict2 local_7fc;
  key_type local_7f8;
  value_type_conflict2 local_7f4;
  key_type local_7f0;
  value_type_conflict2 local_7ec;
  key_type local_7e8;
  value_type_conflict2 local_7e4;
  key_type local_7e0;
  value_type_conflict2 local_7dc;
  key_type local_7d8;
  value_type_conflict2 local_7d4;
  key_type local_7d0;
  value_type_conflict2 local_7cc;
  key_type local_7c8;
  value_type_conflict2 local_7c4;
  key_type local_7c0;
  value_type_conflict2 local_7bc;
  key_type local_7b8;
  value_type_conflict2 local_7b4;
  key_type local_7b0;
  value_type_conflict2 local_7ac;
  key_type local_7a8;
  value_type_conflict2 local_7a4;
  key_type local_7a0;
  value_type_conflict2 local_79c;
  key_type local_798;
  value_type_conflict2 local_794;
  key_type local_790;
  value_type_conflict2 local_78c;
  key_type local_788;
  value_type_conflict2 local_784;
  key_type local_780;
  value_type_conflict2 local_77c;
  key_type local_778;
  value_type_conflict2 local_774;
  key_type local_770;
  value_type_conflict2 local_76c;
  key_type local_768;
  value_type_conflict2 local_764;
  key_type local_760;
  value_type_conflict2 local_75c;
  key_type local_758;
  value_type_conflict2 local_754;
  key_type local_750;
  value_type_conflict2 local_74c;
  key_type local_748;
  value_type_conflict2 local_744;
  key_type local_740 [2];
  pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_738;
  key_type local_704;
  pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_700;
  value_type_conflict2 local_6cc;
  key_type local_6c8;
  value_type_conflict2 local_6c4;
  key_type local_6c0;
  value_type_conflict2 local_6bc;
  key_type local_6b8;
  value_type_conflict2 local_6b4;
  key_type local_6b0;
  value_type_conflict2 local_6ac;
  key_type local_6a8;
  value_type_conflict2 local_6a4;
  key_type local_6a0;
  value_type_conflict2 local_69c;
  key_type local_698;
  value_type_conflict2 local_694;
  key_type local_690;
  value_type_conflict2 local_68c;
  key_type local_688;
  value_type_conflict2 local_684;
  key_type local_680;
  value_type_conflict2 local_67c;
  key_type local_678;
  value_type_conflict2 local_674;
  key_type local_670;
  value_type_conflict2 local_66c;
  key_type local_668;
  value_type_conflict2 local_664;
  key_type local_660;
  value_type_conflict2 local_65c;
  key_type local_658;
  value_type_conflict2 local_654;
  key_type local_650;
  value_type_conflict2 local_64c;
  key_type local_648;
  value_type_conflict2 local_644;
  key_type local_640;
  value_type_conflict2 local_63c;
  key_type local_638;
  value_type_conflict2 local_634;
  key_type local_630;
  value_type_conflict2 local_62c;
  key_type local_628;
  value_type_conflict2 local_624;
  key_type local_620;
  value_type_conflict2 local_61c;
  key_type local_618;
  value_type_conflict2 local_614;
  key_type local_610;
  value_type_conflict2 local_60c;
  key_type local_608;
  value_type_conflict2 local_604;
  key_type local_600;
  value_type_conflict2 local_5fc;
  key_type local_5f8;
  value_type_conflict2 local_5f4;
  key_type local_5f0;
  value_type_conflict2 local_5ec;
  key_type local_5e8;
  value_type_conflict2 local_5e4;
  key_type local_5e0;
  value_type_conflict2 local_5dc;
  key_type local_5d8;
  value_type_conflict2 local_5d4;
  key_type local_5d0;
  value_type_conflict2 local_5cc;
  key_type local_5c8;
  value_type_conflict2 local_5c4;
  key_type local_5c0;
  value_type_conflict2 local_5bc;
  key_type local_5b8;
  value_type_conflict2 local_5b4;
  key_type local_5b0;
  value_type_conflict2 local_5ac;
  key_type local_5a8;
  value_type_conflict2 local_5a4;
  key_type local_5a0 [2];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_598;
  key_type local_57c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_578;
  key_type local_55c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_558;
  key_type local_53c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_538;
  key_type local_51c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_518;
  key_type local_4fc;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_4f8;
  key_type local_4dc;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_4d8;
  key_type local_4bc;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_4b8;
  key_type local_49c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_498;
  key_type local_47c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_478;
  key_type local_45c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_458;
  key_type local_43c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_438;
  key_type local_41c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_418;
  key_type local_3fc;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_3f8;
  key_type local_3dc;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_3d8;
  key_type local_3bc;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_3b8;
  key_type local_39c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_398;
  key_type local_37c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_378;
  key_type local_35c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_358;
  value_type_conflict2 local_33c;
  key_type local_338;
  value_type_conflict2 local_334;
  key_type local_330;
  value_type_conflict2 local_32c;
  key_type local_328;
  value_type_conflict2 local_324;
  key_type local_320;
  value_type_conflict2 local_31c;
  key_type local_318;
  value_type_conflict2 local_314;
  key_type local_310;
  value_type_conflict2 local_30c;
  key_type local_308;
  value_type_conflict2 local_304;
  key_type local_300;
  value_type_conflict2 local_2fc;
  key_type local_2f8;
  value_type_conflict2 local_2f4;
  key_type local_2f0;
  value_type_conflict2 local_2ec;
  key_type local_2e8;
  value_type_conflict2 local_2e4;
  key_type local_2e0;
  value_type_conflict2 local_2dc;
  key_type local_2d8;
  value_type_conflict2 local_2d4;
  key_type local_2d0;
  value_type_conflict2 local_2cc;
  key_type local_2c8;
  value_type_conflict2 local_2c4;
  key_type local_2c0;
  value_type_conflict2 local_2bc;
  key_type local_2b8;
  value_type_conflict2 local_2b4;
  key_type local_2b0;
  value_type_conflict2 local_2ac;
  key_type local_2a8;
  value_type_conflict2 local_2a4;
  key_type local_2a0;
  value_type_conflict2 local_29c;
  key_type local_298;
  value_type_conflict2 local_294;
  key_type local_290;
  value_type_conflict2 local_28c;
  key_type local_288;
  value_type_conflict2 local_284;
  key_type local_280;
  value_type_conflict2 local_27c;
  key_type local_278;
  value_type_conflict2 local_274;
  key_type local_270;
  value_type_conflict2 local_26c;
  key_type local_268;
  value_type_conflict2 local_264;
  key_type local_260;
  value_type_conflict2 local_25c;
  key_type local_258;
  value_type_conflict2 local_254;
  key_type local_250;
  value_type_conflict2 local_24c;
  key_type local_248;
  value_type_conflict2 local_244;
  key_type local_240;
  value_type_conflict2 local_23c;
  key_type local_238;
  value_type_conflict2 local_234;
  key_type local_230;
  value_type_conflict2 local_22c;
  key_type local_228;
  value_type_conflict2 local_224;
  key_type local_220;
  value_type_conflict2 local_21c;
  key_type local_218;
  value_type_conflict2 local_214;
  key_type local_210;
  value_type_conflict2 local_20c;
  key_type local_208;
  value_type_conflict2 local_204;
  key_type local_200;
  value_type_conflict2 local_1fc;
  key_type local_1f8;
  value_type_conflict2 local_1f4;
  key_type local_1f0;
  value_type_conflict2 local_1ec;
  key_type local_1e8;
  value_type_conflict2 local_1e4;
  key_type local_1e0;
  value_type_conflict2 local_1dc;
  key_type local_1d8;
  value_type_conflict2 local_1d4;
  key_type local_1d0 [2];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1c8;
  key_type local_1ac;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1a8;
  key_type local_18c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_188;
  key_type local_16c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_168;
  key_type local_14c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_148;
  key_type local_12c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_128;
  key_type local_10c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_108;
  key_type local_ec;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_e8;
  undefined1 local_c8 [8];
  map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  mixedViewClasses;
  map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  compressedTextureFormatViewClasses;
  map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  textureFormatViewClasses;
  TestCaseGroup *mixedGroup;
  TestCaseGroup *compressedGroup;
  TestCaseGroup *nonCompressedGroup;
  CopyImageTests *this_local;
  
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).m_context,"non_compressed",
             "Test copying between textures.");
  this_01 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_01,(this->super_TestCaseGroup).m_context,"compressed",
             "Test copying between compressed textures.");
  this_02 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_02,(this->super_TestCaseGroup).m_context,"mixed",
             "Test copying between compressed and non-compressed textures.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_02);
  this_00 = &compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::
  map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::map((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
         *)this_00);
  std::
  map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::map((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
         *)&mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  ::map((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
         *)local_c8);
  local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_e8);
  local_ec = VIEWCLASS_128_BITS;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)this_00,&local_ec);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(pmVar5,&local_e8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_e8);
  local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_108);
  local_10c = VIEWCLASS_96_BITS;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,&local_10c);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(pmVar5,&local_108);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_108);
  local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_128);
  local_12c = VIEWCLASS_64_BITS;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,&local_12c);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(pmVar5,&local_128);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_148);
  local_14c = VIEWCLASS_48_BITS;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,&local_14c);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(pmVar5,&local_148);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_148);
  local_168.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_168);
  local_16c = VIEWCLASS_32_BITS;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,&local_16c);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(pmVar5,&local_168);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_168);
  local_188.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_188);
  local_18c = VIEWCLASS_24_BITS;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,&local_18c);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(pmVar5,&local_188);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_188);
  local_1a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_1a8);
  local_1ac = VIEWCLASS_16_BITS;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,&local_1ac);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(pmVar5,&local_1a8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_1a8);
  local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_1c8);
  local_1d0[1] = 7;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,local_1d0 + 1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(pmVar5,&local_1c8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_1c8);
  local_1d0[0] = VIEWCLASS_128_BITS;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,local_1d0);
  local_1d4 = 0x8814;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_1d4);
  local_1d8 = VIEWCLASS_128_BITS;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,&local_1d8);
  local_1dc = 0x8d82;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_1dc);
  local_1e0 = VIEWCLASS_128_BITS;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,&local_1e0);
  local_1e4 = 0x8d70;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_1e4);
  local_1e8 = VIEWCLASS_96_BITS;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,&local_1e8);
  local_1ec = 0x8815;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_1ec);
  local_1f0 = VIEWCLASS_96_BITS;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,&local_1f0);
  local_1f4 = 0x8d83;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_1f4);
  local_1f8 = VIEWCLASS_96_BITS;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,&local_1f8);
  local_1fc = 0x8d71;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_1fc);
  local_200 = VIEWCLASS_64_BITS;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,&local_200);
  local_204 = 0x8230;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_204);
  local_208 = VIEWCLASS_64_BITS;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,&local_208);
  local_20c = 0x823b;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_20c);
  local_210 = VIEWCLASS_64_BITS;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,&local_210);
  local_214 = 0x823c;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_214);
  local_218 = VIEWCLASS_64_BITS;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,&local_218);
  local_21c = 0x881a;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_21c);
  local_220 = VIEWCLASS_64_BITS;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,&local_220);
  local_224 = 0x8d88;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_224);
  local_228 = VIEWCLASS_64_BITS;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,&local_228);
  local_22c = 0x8d76;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_22c);
  local_230 = VIEWCLASS_48_BITS;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,&local_230);
  local_234 = 0x881b;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_234);
  local_238 = VIEWCLASS_48_BITS;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,&local_238);
  local_23c = 0x8d89;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_23c);
  local_240 = VIEWCLASS_48_BITS;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,&local_240);
  local_244 = 0x8d77;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_244);
  local_248 = VIEWCLASS_32_BITS;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,&local_248);
  local_24c = 0x822e;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_24c);
  local_250 = VIEWCLASS_32_BITS;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,&local_250);
  local_254 = 0x8235;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_254);
  local_258 = VIEWCLASS_32_BITS;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,&local_258);
  local_25c = 0x8236;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_25c);
  local_260 = VIEWCLASS_32_BITS;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,&local_260);
  local_264 = 0x822f;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_264);
  local_268 = VIEWCLASS_32_BITS;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,&local_268);
  local_26c = 0x8239;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_26c);
  local_270 = VIEWCLASS_32_BITS;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,&local_270);
  local_274 = 0x823a;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_274);
  local_278 = VIEWCLASS_32_BITS;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,&local_278);
  local_27c = 0x8058;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_27c);
  local_280 = VIEWCLASS_32_BITS;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,&local_280);
  local_284 = 0x8d8e;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_284);
  local_288 = VIEWCLASS_32_BITS;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,&local_288);
  local_28c = 0x8d7c;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_28c);
  local_290 = VIEWCLASS_32_BITS;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,&local_290);
  local_294 = 0x8c3a;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_294);
  local_298 = VIEWCLASS_32_BITS;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,&local_298);
  local_29c = 0x906f;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_29c);
  local_2a0 = VIEWCLASS_32_BITS;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,&local_2a0);
  local_2a4 = 0x8059;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_2a4);
  local_2a8 = VIEWCLASS_32_BITS;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,&local_2a8);
  local_2ac = 0x8f97;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_2ac);
  local_2b0 = VIEWCLASS_32_BITS;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,&local_2b0);
  local_2b4 = 0x8c43;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_2b4);
  local_2b8 = VIEWCLASS_32_BITS;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,&local_2b8);
  local_2bc = 0x8c3d;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_2bc);
  local_2c0 = VIEWCLASS_24_BITS;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,&local_2c0);
  local_2c4 = 0x8051;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_2c4);
  local_2c8 = VIEWCLASS_24_BITS;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,&local_2c8);
  local_2cc = 0x8d8f;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_2cc);
  local_2d0 = VIEWCLASS_24_BITS;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,&local_2d0);
  local_2d4 = 0x8d7d;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_2d4);
  local_2d8 = VIEWCLASS_24_BITS;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,&local_2d8);
  local_2dc = 0x8f96;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_2dc);
  local_2e0 = VIEWCLASS_24_BITS;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,&local_2e0);
  local_2e4 = 0x8c41;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_2e4);
  local_2e8 = VIEWCLASS_16_BITS;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,&local_2e8);
  local_2ec = 0x822d;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_2ec);
  local_2f0 = VIEWCLASS_16_BITS;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,&local_2f0);
  local_2f4 = 0x8233;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_2f4);
  local_2f8 = VIEWCLASS_16_BITS;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,&local_2f8);
  local_2fc = 0x8234;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_2fc);
  local_300 = VIEWCLASS_16_BITS;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,&local_300);
  local_304 = 0x822b;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_304);
  local_308 = VIEWCLASS_16_BITS;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,&local_308);
  local_30c = 0x8237;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_30c);
  local_310 = VIEWCLASS_16_BITS;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,&local_310);
  local_314 = 0x8238;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_314);
  local_318 = VIEWCLASS_16_BITS;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,&local_318);
  local_31c = 0x8f95;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_31c);
  local_320 = VIEWCLASS_8_BITS;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,&local_320);
  local_324 = 0x8229;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_324);
  local_328 = VIEWCLASS_8_BITS;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,&local_328);
  local_32c = 0x8231;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_32c);
  local_330 = VIEWCLASS_8_BITS;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,&local_330);
  local_334 = 0x8232;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_334);
  local_338 = VIEWCLASS_8_BITS;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,&local_338);
  local_33c = 0x8f94;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_33c);
  local_358.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_358.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_358.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_358);
  local_35c = VIEWCLASS_EAC_R11;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &local_35c);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(pmVar5,&local_358);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_358);
  local_378.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_378.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_378.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_378);
  local_37c = VIEWCLASS_EAC_RG11;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &local_37c);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(pmVar5,&local_378);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_378);
  local_398.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_398.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_398.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_398);
  local_39c = VIEWCLASS_ETC2_RGB;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &local_39c);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(pmVar5,&local_398);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_398);
  local_3b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_3b8);
  local_3bc = VIEWCLASS_ETC2_RGBA;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &local_3bc);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(pmVar5,&local_3b8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_3b8);
  local_3d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_3d8);
  local_3dc = VIEWCLASS_ETC2_EAC_RGBA;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &local_3dc);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(pmVar5,&local_3d8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_3d8);
  local_3f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_3f8);
  local_3fc = VIEWCLASS_ASTC_4x4_RGBA;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &local_3fc);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(pmVar5,&local_3f8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_3f8);
  local_418.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_418.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_418.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_418);
  local_41c = VIEWCLASS_ASTC_5x4_RGBA;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &local_41c);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(pmVar5,&local_418);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_418);
  local_438.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_438.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_438.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_438);
  local_43c = VIEWCLASS_ASTC_5x5_RGBA;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &local_43c);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(pmVar5,&local_438);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_438);
  local_458.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_458.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_458.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_458);
  local_45c = VIEWCLASS_ASTC_6x5_RGBA;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &local_45c);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(pmVar5,&local_458);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_458);
  local_478.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_478.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_478.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_478);
  local_47c = VIEWCLASS_ASTC_6x6_RGBA;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &local_47c);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(pmVar5,&local_478);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_478);
  local_498.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_498.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_498.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_498);
  local_49c = VIEWCLASS_ASTC_8x5_RGBA;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &local_49c);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(pmVar5,&local_498);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_498);
  local_4b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_4b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_4b8);
  local_4bc = VIEWCLASS_ASTC_8x6_RGBA;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &local_4bc);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(pmVar5,&local_4b8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_4b8);
  local_4d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_4d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_4d8);
  local_4dc = VIEWCLASS_ASTC_8x8_RGBA;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &local_4dc);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(pmVar5,&local_4d8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_4d8);
  local_4f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_4f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_4f8);
  local_4fc = VIEWCLASS_ASTC_10x5_RGBA;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &local_4fc);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(pmVar5,&local_4f8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_4f8);
  local_518.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_518.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_518.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_518);
  local_51c = VIEWCLASS_ASTC_10x6_RGBA;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &local_51c);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(pmVar5,&local_518);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_518);
  local_538.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_538.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_538.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_538);
  local_53c = VIEWCLASS_ASTC_10x8_RGBA;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &local_53c);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(pmVar5,&local_538);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_538);
  local_558.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_558.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_558.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_558);
  local_55c = VIEWCLASS_ASTC_10x10_RGBA;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &local_55c);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(pmVar5,&local_558);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_558);
  local_578.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_578.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_578.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_578);
  local_57c = VIEWCLASS_ASTC_12x10_RGBA;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &local_57c);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(pmVar5,&local_578);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_578);
  local_598.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_598.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_598.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_598);
  local_5a0[1] = 0x1a;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        local_5a0 + 1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(pmVar5,&local_598);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_598);
  local_5a0[0] = VIEWCLASS_EAC_R11;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        local_5a0);
  local_5a4 = 0x9270;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_5a4);
  local_5a8 = VIEWCLASS_EAC_R11;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &local_5a8);
  local_5ac = 0x9271;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_5ac);
  local_5b0 = VIEWCLASS_EAC_RG11;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &local_5b0);
  local_5b4 = 0x9272;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_5b4);
  local_5b8 = VIEWCLASS_EAC_RG11;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &local_5b8);
  local_5bc = 0x9273;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_5bc);
  local_5c0 = VIEWCLASS_ETC2_RGB;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &local_5c0);
  local_5c4 = 0x9274;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_5c4);
  local_5c8 = VIEWCLASS_ETC2_RGB;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &local_5c8);
  local_5cc = 0x9275;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_5cc);
  local_5d0 = VIEWCLASS_ETC2_RGBA;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &local_5d0);
  local_5d4 = 0x9276;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_5d4);
  local_5d8 = VIEWCLASS_ETC2_RGBA;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &local_5d8);
  local_5dc = 0x9277;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_5dc);
  local_5e0 = VIEWCLASS_ETC2_EAC_RGBA;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &local_5e0);
  local_5e4 = 0x9278;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_5e4);
  local_5e8 = VIEWCLASS_ETC2_EAC_RGBA;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &local_5e8);
  local_5ec = 0x9279;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_5ec);
  local_5f0 = VIEWCLASS_ASTC_4x4_RGBA;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &local_5f0);
  local_5f4 = 0x93b0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_5f4);
  local_5f8 = VIEWCLASS_ASTC_4x4_RGBA;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &local_5f8);
  local_5fc = 0x93d0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_5fc);
  local_600 = VIEWCLASS_ASTC_5x4_RGBA;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &local_600);
  local_604 = 0x93b1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_604);
  local_608 = VIEWCLASS_ASTC_5x4_RGBA;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &local_608);
  local_60c = 0x93d1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_60c);
  local_610 = VIEWCLASS_ASTC_5x5_RGBA;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &local_610);
  local_614 = 0x93b2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_614);
  local_618 = VIEWCLASS_ASTC_5x5_RGBA;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &local_618);
  local_61c = 0x93d2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_61c);
  local_620 = VIEWCLASS_ASTC_6x5_RGBA;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &local_620);
  local_624 = 0x93b3;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_624);
  local_628 = VIEWCLASS_ASTC_6x5_RGBA;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &local_628);
  local_62c = 0x93d3;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_62c);
  local_630 = VIEWCLASS_ASTC_6x6_RGBA;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &local_630);
  local_634 = 0x93b4;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_634);
  local_638 = VIEWCLASS_ASTC_6x6_RGBA;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &local_638);
  local_63c = 0x93d4;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_63c);
  local_640 = VIEWCLASS_ASTC_8x5_RGBA;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &local_640);
  local_644 = 0x93b5;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_644);
  local_648 = VIEWCLASS_ASTC_8x5_RGBA;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &local_648);
  local_64c = 0x93d5;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_64c);
  local_650 = VIEWCLASS_ASTC_8x6_RGBA;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &local_650);
  local_654 = 0x93b6;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_654);
  local_658 = VIEWCLASS_ASTC_8x6_RGBA;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &local_658);
  local_65c = 0x93d6;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_65c);
  local_660 = VIEWCLASS_ASTC_8x8_RGBA;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &local_660);
  local_664 = 0x93b7;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_664);
  local_668 = VIEWCLASS_ASTC_8x8_RGBA;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &local_668);
  local_66c = 0x93d7;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_66c);
  local_670 = VIEWCLASS_ASTC_10x5_RGBA;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &local_670);
  local_674 = 0x93b8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_674);
  local_678 = VIEWCLASS_ASTC_10x5_RGBA;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &local_678);
  local_67c = 0x93d8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_67c);
  local_680 = VIEWCLASS_ASTC_10x6_RGBA;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &local_680);
  local_684 = 0x93b9;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_684);
  local_688 = VIEWCLASS_ASTC_10x6_RGBA;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &local_688);
  local_68c = 0x93d9;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_68c);
  local_690 = VIEWCLASS_ASTC_10x8_RGBA;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &local_690);
  local_694 = 0x93ba;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_694);
  local_698 = VIEWCLASS_ASTC_10x8_RGBA;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &local_698);
  local_69c = 0x93da;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_69c);
  local_6a0 = VIEWCLASS_ASTC_10x10_RGBA;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &local_6a0);
  local_6a4 = 0x93bb;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_6a4);
  local_6a8 = VIEWCLASS_ASTC_10x10_RGBA;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &local_6a8);
  local_6ac = 0x93db;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_6ac);
  local_6b0 = VIEWCLASS_ASTC_12x10_RGBA;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &local_6b0);
  local_6b4 = 0x93bc;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_6b4);
  local_6b8 = VIEWCLASS_ASTC_12x10_RGBA;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &local_6b8);
  local_6bc = 0x93dc;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_6bc);
  local_6c0 = VIEWCLASS_ASTC_12x12_RGBA;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &local_6c0);
  local_6c4 = 0x93bd;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_6c4);
  local_6c8 = VIEWCLASS_ASTC_12x12_RGBA;
  pmVar5 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                         *)&mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &local_6c8);
  local_6cc = 0x93dd;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar5,&local_6cc);
  std::
  pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  ::
  pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_true>
            (&local_700);
  local_704 = VIEWCLASS_128_BITS;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                         *)local_c8,&local_704);
  std::
  pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  ::operator=(pmVar6,&local_700);
  std::
  pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  ::~pair(&local_700);
  std::
  pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  ::
  pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_true>
            (&local_738);
  local_740[1] = 2;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                         *)local_c8,local_740 + 1);
  std::
  pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  ::operator=(pmVar6,&local_738);
  std::
  pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  ::~pair(&local_738);
  local_740[0] = VIEWCLASS_128_BITS;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                         *)local_c8,local_740);
  local_744 = 0x8814;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&pmVar6->first,&local_744);
  local_748 = VIEWCLASS_128_BITS;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                         *)local_c8,&local_748);
  local_74c = 0x8d70;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&pmVar6->first,&local_74c);
  local_750 = VIEWCLASS_128_BITS;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                         *)local_c8,&local_750);
  local_754 = 0x8d82;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&pmVar6->first,&local_754);
  local_758 = VIEWCLASS_128_BITS;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                         *)local_c8,&local_758);
  local_75c = 0x9278;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&pmVar6->second,&local_75c);
  local_760 = VIEWCLASS_128_BITS;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                         *)local_c8,&local_760);
  local_764 = 0x9279;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&pmVar6->second,&local_764);
  local_768 = VIEWCLASS_128_BITS;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                         *)local_c8,&local_768);
  local_76c = 0x9272;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&pmVar6->second,&local_76c);
  local_770 = VIEWCLASS_128_BITS;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                         *)local_c8,&local_770);
  local_774 = 0x9273;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&pmVar6->second,&local_774);
  local_778 = VIEWCLASS_128_BITS;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                         *)local_c8,&local_778);
  local_77c = 0x93b0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&pmVar6->second,&local_77c);
  local_780 = VIEWCLASS_128_BITS;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                         *)local_c8,&local_780);
  local_784 = 0x93b1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&pmVar6->second,&local_784);
  local_788 = VIEWCLASS_128_BITS;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                         *)local_c8,&local_788);
  local_78c = 0x93b2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&pmVar6->second,&local_78c);
  local_790 = VIEWCLASS_128_BITS;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                         *)local_c8,&local_790);
  local_794 = 0x93b3;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&pmVar6->second,&local_794);
  local_798 = VIEWCLASS_128_BITS;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                         *)local_c8,&local_798);
  local_79c = 0x93b4;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&pmVar6->second,&local_79c);
  local_7a0 = VIEWCLASS_128_BITS;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                         *)local_c8,&local_7a0);
  local_7a4 = 0x93b5;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&pmVar6->second,&local_7a4);
  local_7a8 = VIEWCLASS_128_BITS;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                         *)local_c8,&local_7a8);
  local_7ac = 0x93b6;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&pmVar6->second,&local_7ac);
  local_7b0 = VIEWCLASS_128_BITS;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                         *)local_c8,&local_7b0);
  local_7b4 = 0x93b7;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&pmVar6->second,&local_7b4);
  local_7b8 = VIEWCLASS_128_BITS;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                         *)local_c8,&local_7b8);
  local_7bc = 0x93b8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&pmVar6->second,&local_7bc);
  local_7c0 = VIEWCLASS_128_BITS;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                         *)local_c8,&local_7c0);
  local_7c4 = 0x93b9;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&pmVar6->second,&local_7c4);
  local_7c8 = VIEWCLASS_128_BITS;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                         *)local_c8,&local_7c8);
  local_7cc = 0x93ba;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&pmVar6->second,&local_7cc);
  local_7d0 = VIEWCLASS_128_BITS;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                         *)local_c8,&local_7d0);
  local_7d4 = 0x93bb;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&pmVar6->second,&local_7d4);
  local_7d8 = VIEWCLASS_128_BITS;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                         *)local_c8,&local_7d8);
  local_7dc = 0x93bc;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&pmVar6->second,&local_7dc);
  local_7e0 = VIEWCLASS_128_BITS;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                         *)local_c8,&local_7e0);
  local_7e4 = 0x93bd;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&pmVar6->second,&local_7e4);
  local_7e8 = VIEWCLASS_128_BITS;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                         *)local_c8,&local_7e8);
  local_7ec = 0x93d0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&pmVar6->second,&local_7ec);
  local_7f0 = VIEWCLASS_128_BITS;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                         *)local_c8,&local_7f0);
  local_7f4 = 0x93d1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&pmVar6->second,&local_7f4);
  local_7f8 = VIEWCLASS_128_BITS;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                         *)local_c8,&local_7f8);
  local_7fc = 0x93d2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&pmVar6->second,&local_7fc);
  local_800 = VIEWCLASS_128_BITS;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                         *)local_c8,&local_800);
  local_804 = 0x93d3;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&pmVar6->second,&local_804);
  local_808 = VIEWCLASS_128_BITS;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                         *)local_c8,&local_808);
  local_80c = 0x93d4;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&pmVar6->second,&local_80c);
  local_810 = VIEWCLASS_128_BITS;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                         *)local_c8,&local_810);
  local_814 = 0x93d5;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&pmVar6->second,&local_814);
  local_818 = VIEWCLASS_128_BITS;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                         *)local_c8,&local_818);
  local_81c = 0x93d6;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&pmVar6->second,&local_81c);
  local_820 = VIEWCLASS_128_BITS;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                         *)local_c8,&local_820);
  local_824 = 0x93d7;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&pmVar6->second,&local_824);
  local_828 = VIEWCLASS_128_BITS;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                         *)local_c8,&local_828);
  local_82c = 0x93d8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&pmVar6->second,&local_82c);
  local_830 = VIEWCLASS_128_BITS;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                         *)local_c8,&local_830);
  local_834 = 0x93d9;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&pmVar6->second,&local_834);
  local_838 = VIEWCLASS_128_BITS;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                         *)local_c8,&local_838);
  local_83c = 0x93da;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&pmVar6->second,&local_83c);
  local_840 = VIEWCLASS_128_BITS;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                         *)local_c8,&local_840);
  local_844 = 0x93db;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&pmVar6->second,&local_844);
  local_848 = VIEWCLASS_128_BITS;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                         *)local_c8,&local_848);
  local_84c = 0x93dc;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&pmVar6->second,&local_84c);
  local_850 = VIEWCLASS_128_BITS;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                         *)local_c8,&local_850);
  local_854 = 0x93dd;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&pmVar6->second,&local_854);
  local_858 = VIEWCLASS_64_BITS;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                         *)local_c8,&local_858);
  local_85c = 0x881a;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&pmVar6->first,&local_85c);
  local_860 = VIEWCLASS_64_BITS;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                         *)local_c8,&local_860);
  local_864 = 0x8d76;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&pmVar6->first,&local_864);
  local_868 = VIEWCLASS_64_BITS;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                         *)local_c8,&local_868);
  local_86c = 0x8d88;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&pmVar6->first,&local_86c);
  local_870 = VIEWCLASS_64_BITS;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                         *)local_c8,&local_870);
  local_874 = 0x8230;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&pmVar6->first,&local_874);
  local_878 = VIEWCLASS_64_BITS;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                         *)local_c8,&local_878);
  local_87c = 0x823c;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&pmVar6->first,&local_87c);
  local_880 = VIEWCLASS_64_BITS;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                         *)local_c8,&local_880);
  local_884 = 0x823b;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&pmVar6->first,&local_884);
  local_888 = VIEWCLASS_64_BITS;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                         *)local_c8,&local_888);
  local_88c = 0x9270;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&pmVar6->second,&local_88c);
  local_890 = VIEWCLASS_64_BITS;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[]((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                         *)local_c8,&local_890);
  viewClassIter._M_node._4_4_ = 0x9271;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&pmVar6->second,(value_type_conflict2 *)((long)&viewClassIter._M_node + 4));
  local_8a8._M_node =
       (_Base_ptr)
       std::
       map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
       ::begin((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                *)&compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header.
                   _M_node_count);
  std::
  _Rb_tree_const_iterator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::_Rb_tree_const_iterator(&local_8a0,&local_8a8);
  while( true ) {
    formats = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
              std::
              map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              ::end((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                     *)&compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header.
                        _M_node_count);
    std::
    _Rb_tree_const_iterator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::_Rb_tree_const_iterator(&local_8b0,(iterator *)&formats);
    bVar3 = std::operator!=(&local_8a0,&local_8b0);
    if (!bVar3) break;
    ppVar8 = std::
             _Rb_tree_const_iterator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator->(&local_8a0);
    pvVar7 = &ppVar8->second;
    ppVar8 = std::
             _Rb_tree_const_iterator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator->(&local_8a0);
    VVar1 = ppVar8->first;
    this_03 = (TestCaseGroup *)operator_new(0x78);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    pcVar10 = viewClassToName(VVar1);
    pcVar11 = viewClassToName(VVar1);
    TestCaseGroup::TestCaseGroup(this_03,pCVar2,pcVar10,pcVar11);
    tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)this_03);
    for (srcFormat = 0;
        sVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar7),
        (int)srcFormat < (int)sVar12; srcFormat = srcFormat + 1) {
      for (dstFormat = 0;
          sVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar7),
          (int)dstFormat < (int)sVar12; dstFormat = dstFormat + 1) {
        pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (pvVar7,(long)(int)srcFormat);
        viewClassIter_1._M_node._4_4_ = *pvVar13;
        pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (pvVar7,(long)(int)dstFormat);
        viewClassIter_1._M_node._0_4_ = *pvVar13;
        if (((viewClassIter_1._M_node._4_4_ == (value_type)viewClassIter_1._M_node) ||
            (bVar3 = isFloatFormat(viewClassIter_1._M_node._4_4_), !bVar3)) ||
           (bVar3 = isFloatFormat((value_type)viewClassIter_1._M_node), !bVar3)) {
          addCopyTests(this_03,viewClassIter_1._M_node._4_4_,(value_type)viewClassIter_1._M_node);
        }
      }
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::operator++(&local_8a0);
  }
  local_8f0._M_node =
       (_Base_ptr)
       std::
       map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
       ::begin((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                *)&mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree_const_iterator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::_Rb_tree_const_iterator(&local_8e8,&local_8f0);
  while( true ) {
    formats_1 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                std::
                map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                ::end((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                       *)&mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    _Rb_tree_const_iterator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::_Rb_tree_const_iterator(&local_8f8,(iterator *)&formats_1);
    bVar3 = std::operator!=(&local_8e8,&local_8f8);
    if (!bVar3) break;
    ppVar8 = std::
             _Rb_tree_const_iterator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator->(&local_8e8);
    pvVar7 = &ppVar8->second;
    ppVar8 = std::
             _Rb_tree_const_iterator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator->(&local_8e8);
    VVar1 = ppVar8->first;
    pTVar4 = (TestCaseGroup *)operator_new(0x78);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    pcVar10 = viewClassToName(VVar1);
    pcVar11 = viewClassToName(VVar1);
    TestCaseGroup::TestCaseGroup(pTVar4,pCVar2,pcVar10,pcVar11);
    tcu::TestNode::addChild((TestNode *)this_01,(TestNode *)pTVar4);
    for (srcFormat_1 = 0;
        sVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar7),
        (int)srcFormat_1 < (int)sVar12; srcFormat_1 = srcFormat_1 + 1) {
      for (dstFormat_1 = 0;
          sVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar7),
          (int)dstFormat_1 < (int)sVar12; dstFormat_1 = dstFormat_1 + 1) {
        pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (pvVar7,(long)(int)srcFormat_1);
        iter._M_node._4_4_ = *pvVar13;
        pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (pvVar7,(long)(int)dstFormat_1);
        iter._M_node._0_4_ = *pvVar13;
        if (((iter._M_node._4_4_ == (value_type)iter._M_node) ||
            (bVar3 = isFloatFormat(iter._M_node._4_4_), !bVar3)) ||
           (bVar3 = isFloatFormat((value_type)iter._M_node), !bVar3)) {
          addCopyTests(pTVar4,iter._M_node._4_4_,(value_type)iter._M_node);
        }
      }
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::operator++(&local_8e8);
  }
  local_938._M_node =
       (_Base_ptr)
       std::
       map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
       ::begin((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                *)local_c8);
  std::
  _Rb_tree_const_iterator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::_Rb_tree_const_iterator(&local_930,&local_938);
  while( true ) {
    iStack_948 = std::
                 map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                 ::end((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                        *)local_c8);
    std::
    _Rb_tree_const_iterator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
    ::_Rb_tree_const_iterator(&local_940,&stack0xfffffffffffff6b8);
    bVar3 = std::operator!=(&local_930,&local_940);
    if (!bVar3) break;
    ppVar9 = std::
             _Rb_tree_const_iterator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
             ::operator->(&local_930);
    viewClassName.field_2._12_4_ = ppVar9->first;
    pcVar10 = viewClassToName(viewClassName.field_2._12_4_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_990,pcVar10,(allocator<char> *)((long)&viewGroup_2 + 7));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_970,
                   &local_990,"_mixed");
    std::__cxx11::string::~string((string *)&local_990);
    std::allocator<char>::~allocator((allocator<char> *)((long)&viewGroup_2 + 7));
    pTVar4 = (TestCaseGroup *)operator_new(0x78);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    pcVar10 = (char *)std::__cxx11::string::c_str();
    pcVar11 = (char *)std::__cxx11::string::c_str();
    TestCaseGroup::TestCaseGroup(pTVar4,pCVar2,pcVar10,pcVar11);
    ppVar9 = std::
             _Rb_tree_const_iterator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
             ::operator->(&local_930);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &compressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&(ppVar9->second).first);
    ppVar9 = std::
             _Rb_tree_const_iterator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
             ::operator->(&local_930);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&dstFormatNdx_2,
               &(ppVar9->second).second);
    tcu::TestNode::addChild((TestNode *)this_02,(TestNode *)pTVar4);
    for (srcFormat_2 = 0;
        sVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            &compressedFormats.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage),
        (int)srcFormat_2 < (int)sVar12; srcFormat_2 = srcFormat_2 + 1) {
      for (dstFormat_2 = 0;
          sVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&dstFormatNdx_2
                             ), (int)dstFormat_2 < (int)sVar12; dstFormat_2 = dstFormat_2 + 1) {
        pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                             &compressedFormats.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,
                             (long)(int)srcFormat_2);
        format = *pvVar13;
        pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&dstFormatNdx_2,
                             (long)(int)dstFormat_2);
        format_00 = *pvVar13;
        if (((format == format_00) || (bVar3 = isFloatFormat(format), !bVar3)) ||
           (bVar3 = isFloatFormat(format_00), !bVar3)) {
          addCopyTests(pTVar4,format,format_00);
          addCopyTests(pTVar4,format_00,format);
        }
      }
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&dstFormatNdx_2);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &compressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)local_970);
    std::
    _Rb_tree_const_iterator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
    ::operator++(&local_930);
  }
  std::
  map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  ::~map((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
          *)local_c8);
  std::
  map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::~map((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
          *)&mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::~map((map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
          *)&compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return extraout_EAX;
}

Assistant:

void CopyImageTests::init (void)
{
	TestCaseGroup* const	nonCompressedGroup	= new TestCaseGroup(m_context, "non_compressed", "Test copying between textures.");
	TestCaseGroup* const	compressedGroup		= new TestCaseGroup(m_context, "compressed", "Test copying between compressed textures.");
	TestCaseGroup* const	mixedGroup			= new TestCaseGroup(m_context, "mixed", "Test copying between compressed and non-compressed textures.");

	addChild(nonCompressedGroup);
	addChild(compressedGroup);
	addChild(mixedGroup);

	map<ViewClass, vector<deUint32> >							textureFormatViewClasses;
	map<ViewClass, vector<deUint32> >							compressedTextureFormatViewClasses;
	map<ViewClass, pair<vector<deUint32>, vector<deUint32> > >	mixedViewClasses;

	// Texture view classes
	textureFormatViewClasses[VIEWCLASS_128_BITS]		= vector<deUint32>();
	textureFormatViewClasses[VIEWCLASS_96_BITS]			= vector<deUint32>();
	textureFormatViewClasses[VIEWCLASS_64_BITS]			= vector<deUint32>();
	textureFormatViewClasses[VIEWCLASS_48_BITS]			= vector<deUint32>();
	textureFormatViewClasses[VIEWCLASS_32_BITS]			= vector<deUint32>();
	textureFormatViewClasses[VIEWCLASS_24_BITS]			= vector<deUint32>();
	textureFormatViewClasses[VIEWCLASS_16_BITS]			= vector<deUint32>();
	textureFormatViewClasses[VIEWCLASS_8_BITS]			= vector<deUint32>();

	// 128bit / VIEWCLASS_128_BITS
	textureFormatViewClasses[VIEWCLASS_128_BITS].push_back(GL_RGBA32F);
	textureFormatViewClasses[VIEWCLASS_128_BITS].push_back(GL_RGBA32I);
	textureFormatViewClasses[VIEWCLASS_128_BITS].push_back(GL_RGBA32UI);

	// 96bit / VIEWCLASS_96_BITS
	textureFormatViewClasses[VIEWCLASS_96_BITS].push_back(GL_RGB32F);
	textureFormatViewClasses[VIEWCLASS_96_BITS].push_back(GL_RGB32I);
	textureFormatViewClasses[VIEWCLASS_96_BITS].push_back(GL_RGB32UI);

	// 64bit / VIEWCLASS_64_BITS
	textureFormatViewClasses[VIEWCLASS_64_BITS].push_back(GL_RG32F);
	textureFormatViewClasses[VIEWCLASS_64_BITS].push_back(GL_RG32I);
	textureFormatViewClasses[VIEWCLASS_64_BITS].push_back(GL_RG32UI);

	textureFormatViewClasses[VIEWCLASS_64_BITS].push_back(GL_RGBA16F);
	textureFormatViewClasses[VIEWCLASS_64_BITS].push_back(GL_RGBA16I);
	textureFormatViewClasses[VIEWCLASS_64_BITS].push_back(GL_RGBA16UI);

	// 48bit / VIEWCLASS_48_BITS
	textureFormatViewClasses[VIEWCLASS_48_BITS].push_back(GL_RGB16F);
	textureFormatViewClasses[VIEWCLASS_48_BITS].push_back(GL_RGB16I);
	textureFormatViewClasses[VIEWCLASS_48_BITS].push_back(GL_RGB16UI);

	// 32bit / VIEWCLASS_32_BITS
	textureFormatViewClasses[VIEWCLASS_32_BITS].push_back(GL_R32F);
	textureFormatViewClasses[VIEWCLASS_32_BITS].push_back(GL_R32I);
	textureFormatViewClasses[VIEWCLASS_32_BITS].push_back(GL_R32UI);

	textureFormatViewClasses[VIEWCLASS_32_BITS].push_back(GL_RG16F);
	textureFormatViewClasses[VIEWCLASS_32_BITS].push_back(GL_RG16I);
	textureFormatViewClasses[VIEWCLASS_32_BITS].push_back(GL_RG16UI);

	textureFormatViewClasses[VIEWCLASS_32_BITS].push_back(GL_RGBA8);
	textureFormatViewClasses[VIEWCLASS_32_BITS].push_back(GL_RGBA8I);
	textureFormatViewClasses[VIEWCLASS_32_BITS].push_back(GL_RGBA8UI);

	textureFormatViewClasses[VIEWCLASS_32_BITS].push_back(GL_R11F_G11F_B10F);
	textureFormatViewClasses[VIEWCLASS_32_BITS].push_back(GL_RGB10_A2UI);
	textureFormatViewClasses[VIEWCLASS_32_BITS].push_back(GL_RGB10_A2);
	textureFormatViewClasses[VIEWCLASS_32_BITS].push_back(GL_RGBA8_SNORM);
	textureFormatViewClasses[VIEWCLASS_32_BITS].push_back(GL_SRGB8_ALPHA8);
	textureFormatViewClasses[VIEWCLASS_32_BITS].push_back(GL_RGB9_E5);

	// 24bit / VIEWCLASS_24_BITS
	textureFormatViewClasses[VIEWCLASS_24_BITS].push_back(GL_RGB8);
	textureFormatViewClasses[VIEWCLASS_24_BITS].push_back(GL_RGB8I);
	textureFormatViewClasses[VIEWCLASS_24_BITS].push_back(GL_RGB8UI);
	textureFormatViewClasses[VIEWCLASS_24_BITS].push_back(GL_RGB8_SNORM);
	textureFormatViewClasses[VIEWCLASS_24_BITS].push_back(GL_SRGB8);

	// 16bit / VIEWCLASS_16_BITS
	textureFormatViewClasses[VIEWCLASS_16_BITS].push_back(GL_R16F);
	textureFormatViewClasses[VIEWCLASS_16_BITS].push_back(GL_R16I);
	textureFormatViewClasses[VIEWCLASS_16_BITS].push_back(GL_R16UI);

	textureFormatViewClasses[VIEWCLASS_16_BITS].push_back(GL_RG8);
	textureFormatViewClasses[VIEWCLASS_16_BITS].push_back(GL_RG8I);
	textureFormatViewClasses[VIEWCLASS_16_BITS].push_back(GL_RG8UI);
	textureFormatViewClasses[VIEWCLASS_16_BITS].push_back(GL_RG8_SNORM);

	// 8bit / VIEWCLASS_8_BITS
	textureFormatViewClasses[VIEWCLASS_8_BITS].push_back(GL_R8);
	textureFormatViewClasses[VIEWCLASS_8_BITS].push_back(GL_R8I);
	textureFormatViewClasses[VIEWCLASS_8_BITS].push_back(GL_R8UI);
	textureFormatViewClasses[VIEWCLASS_8_BITS].push_back(GL_R8_SNORM);

	// Compressed texture view classes
	compressedTextureFormatViewClasses[VIEWCLASS_EAC_R11]			= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_EAC_RG11]			= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ETC2_RGB]			= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ETC2_RGBA]			= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ETC2_EAC_RGBA]		= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_4x4_RGBA]		= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_5x4_RGBA]		= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_5x5_RGBA]		= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_6x5_RGBA]		= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_6x6_RGBA]		= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_8x5_RGBA]		= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_8x6_RGBA]		= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_8x8_RGBA]		= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_10x5_RGBA]	= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_10x6_RGBA]	= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_10x8_RGBA]	= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_10x10_RGBA]	= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_12x10_RGBA]	= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_12x12_RGBA]	= vector<deUint32>();

	// VIEWCLASS_EAC_R11
	compressedTextureFormatViewClasses[VIEWCLASS_EAC_R11].push_back(GL_COMPRESSED_R11_EAC);
	compressedTextureFormatViewClasses[VIEWCLASS_EAC_R11].push_back(GL_COMPRESSED_SIGNED_R11_EAC);

	// VIEWCLASS_EAC_RG11
	compressedTextureFormatViewClasses[VIEWCLASS_EAC_RG11].push_back(GL_COMPRESSED_RG11_EAC);
	compressedTextureFormatViewClasses[VIEWCLASS_EAC_RG11].push_back(GL_COMPRESSED_SIGNED_RG11_EAC);

	// VIEWCLASS_ETC2_RGB
	compressedTextureFormatViewClasses[VIEWCLASS_ETC2_RGB].push_back(GL_COMPRESSED_RGB8_ETC2);
	compressedTextureFormatViewClasses[VIEWCLASS_ETC2_RGB].push_back(GL_COMPRESSED_SRGB8_ETC2);

	// VIEWCLASS_ETC2_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ETC2_RGBA].push_back(GL_COMPRESSED_RGB8_PUNCHTHROUGH_ALPHA1_ETC2);
	compressedTextureFormatViewClasses[VIEWCLASS_ETC2_RGBA].push_back(GL_COMPRESSED_SRGB8_PUNCHTHROUGH_ALPHA1_ETC2);

	// VIEWCLASS_ETC2_EAC_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ETC2_EAC_RGBA].push_back(GL_COMPRESSED_RGBA8_ETC2_EAC);
	compressedTextureFormatViewClasses[VIEWCLASS_ETC2_EAC_RGBA].push_back(GL_COMPRESSED_SRGB8_ALPHA8_ETC2_EAC);

	// VIEWCLASS_ASTC_4x4_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_4x4_RGBA].push_back(GL_COMPRESSED_RGBA_ASTC_4x4);
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_4x4_RGBA].push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_4x4);

	// VIEWCLASS_ASTC_5x4_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_5x4_RGBA].push_back(GL_COMPRESSED_RGBA_ASTC_5x4);
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_5x4_RGBA].push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_5x4);

	// VIEWCLASS_ASTC_5x5_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_5x5_RGBA].push_back(GL_COMPRESSED_RGBA_ASTC_5x5);
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_5x5_RGBA].push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_5x5);

	// VIEWCLASS_ASTC_6x5_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_6x5_RGBA].push_back(GL_COMPRESSED_RGBA_ASTC_6x5);
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_6x5_RGBA].push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_6x5);

	// VIEWCLASS_ASTC_6x6_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_6x6_RGBA].push_back(GL_COMPRESSED_RGBA_ASTC_6x6);
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_6x6_RGBA].push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_6x6);

	// VIEWCLASS_ASTC_8x5_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_8x5_RGBA].push_back(GL_COMPRESSED_RGBA_ASTC_8x5);
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_8x5_RGBA].push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_8x5);

	// VIEWCLASS_ASTC_8x6_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_8x6_RGBA].push_back(GL_COMPRESSED_RGBA_ASTC_8x6);
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_8x6_RGBA].push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_8x6);

	// VIEWCLASS_ASTC_8x8_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_8x8_RGBA].push_back(GL_COMPRESSED_RGBA_ASTC_8x8);
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_8x8_RGBA].push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_8x8);

	// VIEWCLASS_ASTC_10x5_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_10x5_RGBA].push_back(GL_COMPRESSED_RGBA_ASTC_10x5);
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_10x5_RGBA].push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_10x5);

	// VIEWCLASS_ASTC_10x6_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_10x6_RGBA].push_back(GL_COMPRESSED_RGBA_ASTC_10x6);
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_10x6_RGBA].push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_10x6);

	// VIEWCLASS_ASTC_10x8_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_10x8_RGBA].push_back(GL_COMPRESSED_RGBA_ASTC_10x8);
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_10x8_RGBA].push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_10x8);

	// VIEWCLASS_ASTC_10x10_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_10x10_RGBA].push_back(GL_COMPRESSED_RGBA_ASTC_10x10);
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_10x10_RGBA].push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_10x10);

	// VIEWCLASS_ASTC_12x10_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_12x10_RGBA].push_back(GL_COMPRESSED_RGBA_ASTC_12x10);
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_12x10_RGBA].push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_12x10);

	// VIEWCLASS_ASTC_12x12_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_12x12_RGBA].push_back(GL_COMPRESSED_RGBA_ASTC_12x12);
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_12x12_RGBA].push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_12x12);

	// Mixed view classes
	mixedViewClasses[VIEWCLASS_128_BITS] = pair<vector<deUint32>, vector<deUint32> >();
	mixedViewClasses[VIEWCLASS_64_BITS] = pair<vector<deUint32>, vector<deUint32> >();

	// 128 bits

	// Non compressed
	mixedViewClasses[VIEWCLASS_128_BITS].first.push_back(GL_RGBA32F);
	mixedViewClasses[VIEWCLASS_128_BITS].first.push_back(GL_RGBA32UI);
	mixedViewClasses[VIEWCLASS_128_BITS].first.push_back(GL_RGBA32I);

	// Compressed
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RGBA8_ETC2_EAC);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SRGB8_ALPHA8_ETC2_EAC);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RG11_EAC);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SIGNED_RG11_EAC);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RGBA_ASTC_4x4);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RGBA_ASTC_5x4);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RGBA_ASTC_5x5);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RGBA_ASTC_6x5);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RGBA_ASTC_6x6);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RGBA_ASTC_8x5);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RGBA_ASTC_8x6);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RGBA_ASTC_8x8);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RGBA_ASTC_10x5);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RGBA_ASTC_10x6);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RGBA_ASTC_10x8);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RGBA_ASTC_10x10);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RGBA_ASTC_12x10);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RGBA_ASTC_12x12);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_4x4);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_5x4);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_5x5);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_6x5);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_6x6);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_8x5);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_8x6);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_8x8);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_10x5);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_10x6);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_10x8);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_10x10);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_12x10);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_12x12);

	// 64 bits

	// Non compressed
	mixedViewClasses[VIEWCLASS_64_BITS].first.push_back(GL_RGBA16F);
	mixedViewClasses[VIEWCLASS_64_BITS].first.push_back(GL_RGBA16UI);
	mixedViewClasses[VIEWCLASS_64_BITS].first.push_back(GL_RGBA16I);

	mixedViewClasses[VIEWCLASS_64_BITS].first.push_back(GL_RG32F);
	mixedViewClasses[VIEWCLASS_64_BITS].first.push_back(GL_RG32UI);
	mixedViewClasses[VIEWCLASS_64_BITS].first.push_back(GL_RG32I);

	// Compressed
	mixedViewClasses[VIEWCLASS_64_BITS].second.push_back(GL_COMPRESSED_R11_EAC);
	mixedViewClasses[VIEWCLASS_64_BITS].second.push_back(GL_COMPRESSED_SIGNED_R11_EAC);

	for (map<ViewClass, vector<deUint32> >::const_iterator viewClassIter = textureFormatViewClasses.begin(); viewClassIter != textureFormatViewClasses.end(); ++viewClassIter)
	{
		const vector<deUint32>&	formats		= viewClassIter->second;
		const ViewClass			viewClass	= viewClassIter->first;
		TestCaseGroup* const	viewGroup	= new TestCaseGroup(m_context, viewClassToName(viewClass), viewClassToName(viewClass));

		nonCompressedGroup->addChild(viewGroup);

		for (int srcFormatNdx = 0; srcFormatNdx < (int)formats.size(); srcFormatNdx++)
		for (int dstFormatNdx = 0; dstFormatNdx < (int)formats.size(); dstFormatNdx++)
		{
			const deUint32 srcFormat = formats[srcFormatNdx];
			const deUint32 dstFormat = formats[dstFormatNdx];

			if (srcFormat != dstFormat && isFloatFormat(srcFormat) && isFloatFormat(dstFormat))
				continue;

			addCopyTests(viewGroup, srcFormat, dstFormat);
		}
	}

	for (map<ViewClass, vector<deUint32> >::const_iterator viewClassIter = compressedTextureFormatViewClasses.begin(); viewClassIter != compressedTextureFormatViewClasses.end(); ++viewClassIter)
	{
		const vector<deUint32>&	formats		= viewClassIter->second;
		const ViewClass			viewClass	= viewClassIter->first;
		TestCaseGroup* const	viewGroup	= new TestCaseGroup(m_context, viewClassToName(viewClass), viewClassToName(viewClass));

		compressedGroup->addChild(viewGroup);

		for (int srcFormatNdx = 0; srcFormatNdx < (int)formats.size(); srcFormatNdx++)
		for (int dstFormatNdx = 0; dstFormatNdx < (int)formats.size(); dstFormatNdx++)
		{
			const deUint32 srcFormat = formats[srcFormatNdx];
			const deUint32 dstFormat = formats[dstFormatNdx];

			if (srcFormat != dstFormat && isFloatFormat(srcFormat) && isFloatFormat(dstFormat))
				continue;

			addCopyTests(viewGroup, srcFormat, dstFormat);
		}
	}

	for (map<ViewClass, pair<vector<deUint32>, vector<deUint32> > >::const_iterator iter = mixedViewClasses.begin(); iter != mixedViewClasses.end(); ++iter)
	{
		const ViewClass			viewClass				= iter->first;
		const string			viewClassName			= string(viewClassToName(viewClass)) + "_mixed";
		TestCaseGroup* const	viewGroup				= new TestCaseGroup(m_context, viewClassName.c_str(), viewClassName.c_str());

		const vector<deUint32>	nonCompressedFormats	= iter->second.first;
		const vector<deUint32>	compressedFormats		= iter->second.second;

		mixedGroup->addChild(viewGroup);

		for (int srcFormatNdx = 0; srcFormatNdx < (int)nonCompressedFormats.size(); srcFormatNdx++)
		for (int dstFormatNdx = 0; dstFormatNdx < (int)compressedFormats.size(); dstFormatNdx++)
		{
			const deUint32 srcFormat = nonCompressedFormats[srcFormatNdx];
			const deUint32 dstFormat = compressedFormats[dstFormatNdx];

			if (srcFormat != dstFormat && isFloatFormat(srcFormat) && isFloatFormat(dstFormat))
				continue;

			addCopyTests(viewGroup, srcFormat, dstFormat);
			addCopyTests(viewGroup, dstFormat, srcFormat);
		}
	}
}